

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

ostream * despot::operator<<(ostream *os,
                            vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            *vec)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  vector<despot::State,_std::allocator<despot::State>_> vStack_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  if ((vec->
      super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (vec->
      super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      pcVar3 = ", ";
      if (lVar4 == 0) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,(ulong)((uint)(lVar4 != 0) * 2));
      std::vector<despot::State,_std::allocator<despot::State>_>::vector
                (&vStack_48,
                 (vector<despot::State,_std::allocator<despot::State>_> *)
                 ((long)&(((vec->
                           super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<despot::State,_std::allocator<despot::State>_>)._M_impl.
                         super__Vector_impl_data + lVar4));
      operator<<(os,&vStack_48);
      std::vector<despot::State,_std::allocator<despot::State>_>::~vector(&vStack_48);
      uVar2 = uVar2 + 1;
      uVar1 = ((long)(vec->
                     super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vec->
                     super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}